

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O0

int richolu(double *A,int N,int stride,double *U22)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double u11;
  int w;
  int u;
  int i;
  int j;
  int sc;
  double *U22_local;
  int stride_local;
  int N_local;
  double *A_local;
  
  if (N == 1) {
    if (*A <= 0.0) {
      A_local._4_4_ = -1;
    }
    else {
      dVar3 = sqrt(*A);
      *A = dVar3;
      A_local._4_4_ = 0;
    }
  }
  else if (0.0 < *A || *A == 0.0) {
    dVar3 = sqrt(*A);
    *A = dVar3;
    for (u = 1; u < N; u = u + 1) {
      if ((A[u] != 0.0) || (NAN(A[u]))) {
        A[u] = A[u] / dVar3;
      }
    }
    mmult(A + 1,A + 1,U22,N + -1,1,N + -1);
    for (w = 0; w < N + -1; w = w + 1) {
      iVar1 = stride + 1 + w * stride;
      for (u = w; u < N + -1; u = u + 1) {
        if ((A[u + iVar1] != 0.0) || (NAN(A[u + iVar1]))) {
          iVar2 = u + iVar1;
          A[iVar2] = A[iVar2] - U22[u + w * (N + -1)];
        }
      }
    }
    A_local._4_4_ = richolu(A + (long)stride + 1,N + -1,stride,U22);
    if (A_local._4_4_ == -1) {
      A_local._4_4_ = -1;
    }
  }
  else {
    A_local._4_4_ = -1;
  }
  return A_local._4_4_;
}

Assistant:

static int richolu(double *A,int N, int stride, double *U22) {
	int sc;
	int j,i,u,w;
	double u11;
	
	if (N == 1) {
		if (A[0] > 0) {
			A[0] = sqrt(A[0]);
			return 0;
		} else {
			return -1;
		}
	} else {
		if (A[0] < 0) {
			return -1;
		}
		u11 = sqrt(A[0]);
		A[0] = u11;
		for (j = 1; j < N;++j) {
			if (A[j] != 0) {
				A[j] /= u11;
			}
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1 + i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				if (A[j + u] != 0) {
					A[j + u] -= U22[j + w];
				}
			}
		}
		
		sc = richolu(A+stride+1,N-1,stride,U22);
		if (sc == -1) {
			return -1;
		}
		
	}
	
	return sc;
	
}